

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

int invertroot(int q,double *ma)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  double *coeff;
  double *ZEROR;
  double *ZEROI;
  void *__ptr;
  double *__ptr_00;
  double *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  ulong uVar4;
  uint DEGREE;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if (q < 1) {
    return 0;
  }
  uVar7 = (ulong)(uint)q;
  uVar6 = 0xffffffff;
  uVar3 = 0;
  do {
    if (ma[uVar3] != 0.0) {
      uVar6 = uVar3 & 0xffffffff;
    }
    if (NAN(ma[uVar3])) {
      uVar6 = uVar3 & 0xffffffff;
    }
    uVar3 = uVar3 + 1;
  } while (uVar7 != uVar3);
  iVar5 = (int)uVar6;
  if (iVar5 != -1) {
    coeff = (double *)malloc(uVar7 * 8 + 8);
    ZEROR = (double *)malloc(uVar7 * 8);
    ZEROI = (double *)malloc(uVar7 * 8);
    __ptr = malloc(uVar7 << 2);
    DEGREE = iVar5 + 1;
    *coeff = 1.0;
    if (-1 < iVar5) {
      memcpy(coeff + 1,ma,(ulong)DEGREE << 3);
    }
    sVar1 = (long)iVar5 * 8 + 0x10;
    __ptr_00 = (double *)malloc(sVar1);
    __ptr_01 = (double *)malloc(sVar1);
    __ptr_02 = malloc(sVar1);
    __ptr_03 = malloc(sVar1);
    iVar2 = polyroot(coeff,DEGREE,ZEROR,ZEROI);
    if (iVar2 == 1) {
      free(ZEROR);
      free(ZEROI);
      free(coeff);
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
    }
    else {
      if (-1 < iVar5) {
        uVar6 = (ulong)DEGREE;
        uVar3 = 0;
        iVar2 = 0;
        do {
          dVar8 = ZEROR[uVar3];
          dVar10 = ZEROI[uVar3];
          *(undefined4 *)((long)__ptr + uVar3 * 4) = 0;
          if (dVar8 * dVar8 + dVar10 * dVar10 < 1.0) {
            *(undefined4 *)((long)__ptr + uVar3 * 4) = 1;
            iVar2 = iVar2 + 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
        if (iVar2 != 0) {
          if (iVar5 == 0) {
            *ma = 1.0 / *ma;
            if (q != 1) {
              memset(ma + 1,0,(ulong)(q - 1) << 3);
            }
            free(ZEROR);
            free(ZEROI);
            free(coeff);
            free(__ptr);
            free(__ptr_00);
            free(__ptr_01);
            free(__ptr_02);
          }
          else {
            if (-1 < iVar5) {
              uVar3 = 0;
              do {
                if (*(int *)((long)__ptr + uVar3 * 4) == 1) {
                  dVar8 = ZEROR[uVar3];
                  dVar10 = ZEROI[uVar3];
                  dVar12 = dVar8 * dVar8 + dVar10 * dVar10;
                  ZEROR[uVar3] = dVar8 / dVar12;
                  ZEROI[uVar3] = -dVar10 / dVar12;
                }
                uVar3 = uVar3 + 1;
              } while (uVar6 != uVar3);
              *__ptr_00 = 1.0;
              *__ptr_01 = 0.0;
              if (-1 < iVar5) {
                uVar3 = 0;
                do {
                  sVar1 = uVar3 * 8 + 8;
                  uVar7 = uVar3 + 1;
                  dVar8 = ZEROR[uVar3];
                  dVar10 = ZEROI[uVar3];
                  dVar9 = dVar8 * dVar8 + dVar10 * dVar10;
                  dVar8 = dVar8 / dVar9;
                  dVar9 = -dVar10 / dVar9;
                  __ptr_01[uVar3 + 1] = 0.0;
                  __ptr_00[uVar3 + 1] = 0.0;
                  dVar10 = *__ptr_00;
                  dVar12 = *__ptr_01;
                  uVar4 = 0xffffffffffffffff;
                  do {
                    dVar14 = dVar8 * dVar12;
                    dVar13 = dVar12 * -dVar9;
                    dVar15 = dVar8 * dVar10;
                    dVar11 = dVar10 * dVar9;
                    dVar10 = __ptr_00[uVar4 + 2];
                    dVar12 = __ptr_01[uVar4 + 2];
                    *(double *)((long)__ptr_02 + uVar4 * 8 + 0x10) = dVar10 - (dVar15 + dVar13);
                    *(double *)((long)__ptr_03 + uVar4 * 8 + 0x10) = dVar12 - (dVar11 + dVar14);
                    uVar4 = uVar4 + 1;
                  } while (uVar3 != uVar4);
                  memcpy(__ptr_00 + 1,(void *)((long)__ptr_02 + 8),sVar1);
                  memcpy(__ptr_01 + 1,(void *)((long)__ptr_03 + 8),sVar1);
                  uVar3 = uVar7;
                } while (uVar7 != uVar6);
                if (-1 < iVar5) {
                  memcpy(ma,__ptr_00 + 1,uVar6 << 3);
                }
              }
            }
            if ((int)DEGREE < q) {
              memset(ma + (int)DEGREE,0,(ulong)((q - iVar5) - 2) * 8 + 8);
            }
            free(ZEROR);
            free(ZEROI);
            free(coeff);
            free(__ptr);
            free(__ptr_00);
            free(__ptr_01);
            free(__ptr_02);
          }
          free(__ptr_03);
          return 1;
        }
      }
      free(ZEROR);
      free(ZEROI);
      free(coeff);
      free(__ptr);
      free(__ptr_00);
      free(__ptr_01);
    }
    free(__ptr_02);
    free(__ptr_03);
  }
  return 0;
}

Assistant:

int invertroot(int q, double *ma) {
	int i, index, retval, fail, rcheck, qn, i1, j;
	double *temp, *zeror, *zeroi, *xr, *xi,*yr,*yi;
	int *ind;
	double mod,tempr,tempi;


	retval = 0;
	index = -1;
	for (i = 0; i < q; ++i) {
		if (ma[i] != 0.0) {
			index = i;
		}
	}

	if (index == -1) {
		return retval;
	}
	
	temp = (double*)malloc(sizeof(double)* (q + 1));
	zeror = (double*)malloc(sizeof(double)* q);
	zeroi = (double*)malloc(sizeof(double)* q);
	ind = (int*)malloc(sizeof(int)* q);

	index++;
	temp[0] = 1.0;
	for (i = 1; i <= index; ++i) {
		temp[i] = ma[i - 1];
	}

	qn = index;

	xr = (double*)malloc(sizeof(double)* (qn + 1));
	xi = (double*)malloc(sizeof(double)* (qn + 1));
	yr = (double*)malloc(sizeof(double)* (qn + 1));
	yi = (double*)malloc(sizeof(double)* (qn + 1));

	fail = polyroot(temp, qn, zeror, zeroi);

	//mdisplay(zeroi, 1, qn);

	if (fail == 1) {
		free(zeror);
		free(zeroi);
		free(temp);
		free(ind);
		free(xr);
		free(xi);
		free(yr);
		free(yi);
		return retval;
	}

	rcheck = 0;

	for (i = 0; i < qn; ++i) {
		mod = zeror[i] * zeror[i] + zeroi[i] * zeroi[i];
		ind[i] = 0;
		if (mod < 1.0) {
			ind[i] = 1;
			rcheck++;
		}
	}

	if (rcheck == 0) {
		free(zeror);
		free(zeroi);
		free(temp);
		free(ind);
		free(xr);
		free(xi);
		free(yr);
		free(yi);
		return retval;
	}
	else {
		retval = 1;
	}

	if (index == 1) {
		ma[0] = 1.0 / ma[0];
		for (i = 1; i < q; ++i) {
			ma[i] = 0.0;
		}
		free(zeror);
		free(zeroi);
		free(temp);
		free(ind);
		free(xr);
		free(xi);
		free(yr);
		free(yi);
		return retval;
	}

	for (i = 0; i < index; ++i) {
		if (ind[i] == 1) {
			mod = zeror[i] * zeror[i] + zeroi[i] * zeroi[i];
			zeror[i] = zeror[i] / mod;
			zeroi[i] = -zeroi[i] / mod;
		}
	}

	//mdisplay(zeroi, 1, qn);

	xr[0] = 1.0; xi[0] = 0.0;
	yr[0] = xr[0];
	yi[0] = xi[0];

	for (i = 0; i < qn; ++i) {
		i1 = i + 1;
		mod = zeror[i] * zeror[i] + zeroi[i] * zeroi[i];
		tempr = zeror[i] / mod;
		tempi = -zeroi[i] / mod;
		xr[i1] = xi[i1] = 0.0;
		for (j = 1; j <= i1; ++j) {
			yr[j] = tempr * xr[j - 1] - tempi * xi[j - 1];
			yi[j] = tempr * xi[j - 1] + tempi * xr[j - 1];
			yr[j] = xr[j] - yr[j];
			yi[j] = xi[j] - yi[j];
		}
		for (j = 1; j <= i1; ++j) {
			xr[j] = yr[j];
			xi[j] = yi[j];
		}
		//mdisplay(xr, 1, qn+1);
	}

	for (i = 0; i < qn; ++i) {
		ma[i] = xr[i+1];
	}

	for (i = qn; i < q; ++i) {
		ma[i] = 0.0;
	}

	free(zeror);
	free(zeroi);
	free(temp);
	free(ind);
	free(xr);
	free(xi);
	free(yr);
	free(yi);
	return retval;
}